

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void glist_nograb(_glist *x)

{
  _glist *p_Var1;
  t_object *x_00;
  t_gobj *local_28;
  t_gobj *g;
  t_object *ob;
  _glist *canvas;
  _glist *x_local;
  
  if (x->gl_editor != (t_editor *)0x0) {
    p_Var1 = glist_getcanvas(x);
    for (local_28 = p_Var1->gl_list; local_28 != (t_gobj *)0x0; local_28 = local_28->g_next) {
      x_00 = pd_checkobject(&local_28->g_pd);
      if ((x_00 != (t_object *)0x0) && ((x_00->field_0x2e & 3) == 3)) {
        gatom_undarken(x_00);
      }
    }
    x->gl_editor->e_grab = (t_gobj *)0x0;
  }
  return;
}

Assistant:

static void glist_nograb(t_glist *x)
{
    if (x->gl_editor)
    {
        t_canvas *canvas = glist_getcanvas(x);
        t_object *ob;
        t_gobj*g;
        for (g = canvas->gl_list; g; g = g->g_next)
            if ((ob = pd_checkobject(&g->g_pd)) && T_ATOM == ob->te_type)
                gatom_undarken(ob);
        x->gl_editor->e_grab = 0;
    }
}